

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::BlindIssuanceRequest::ConvertFromStruct
          (BlindIssuanceRequest *this,BlindIssuanceRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  this->vout_ = data->vout;
  std::__cxx11::string::_M_assign((string *)&this->asset_blinding_key_);
  std::__cxx11::string::_M_assign((string *)&this->token_blinding_key_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void BlindIssuanceRequest::ConvertFromStruct(
    const BlindIssuanceRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  asset_blinding_key_ = data.asset_blinding_key;
  token_blinding_key_ = data.token_blinding_key;
  ignore_items = data.ignore_items;
}